

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O3

RBTREE_NODE * rbtree_fini_step(RBTREE *tree)

{
  RBTREE_NODE *pRVar1;
  RBTREE_NODE *pRVar2;
  RBTREE_NODE **pointer_down_to_node;
  RBTREE_NODE *pRVar3;
  
  pRVar2 = tree->root;
  if (pRVar2 != (RBTREE_NODE *)0x0) {
    pRVar3 = pRVar2->lc;
    while (pRVar1 = pRVar2, pRVar2 = (RBTREE_NODE *)((ulong)pRVar3 & 0xfffffffffffffffe),
          pRVar2 != (RBTREE_NODE *)0x0) {
      pRVar3 = pRVar2->lc;
      tree = (RBTREE *)pRVar1;
    }
    ((RBTREE_NODE *)tree)->lc = pRVar1->r;
    return pRVar1;
  }
  return (RBTREE_NODE *)0x0;
}

Assistant:

RBTREE_NODE*
rbtree_fini_step(RBTREE* tree)
{
    RBTREE_NODE** pointer_down_to_node = &tree->root;
    RBTREE_NODE* node = tree->root;

    if(node != NULL) {
        /* Go down as far as possible through left children. */
        while(LEFT(node) != NULL) {
            pointer_down_to_node = &node->lc;
            node = LEFT(node);
        }

        /* The node now can have at most one child (the right one). I.e. we can
         * rip out the current node and "upgrade" the right subtree (or NULL)
         * one level up into this node's place. This should be cheaper than
         * iterating to some leaf in the right subtree. */
        *pointer_down_to_node = RIGHT(node);
    }

    return node;
}